

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remote_server.cpp
# Opt level: O0

void PrepareResponseForGet<std::complex<float>>
               (CMConnection conn,Remote_evpath_state *ev_state,GetRequestMsg *GetMsg,
               string *VarName,DataType TypeOfVar,AnonADIOSFile *f)

{
  Variable *pVVar1;
  ostream *poVar2;
  void *pvVar3;
  long lVar4;
  string *in_RCX;
  long *in_RDX;
  undefined4 in_R8D;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_R9;
  Accuracy acc;
  complex<float> *RawData;
  size_t readSize;
  int i;
  Box<Dims> b;
  Variable<std::complex<float>_> *var;
  pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  *in_stack_fffffffffffffe50;
  value_type_conflict *in_stack_fffffffffffffe58;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffe60;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this;
  char *local_110;
  undefined7 in_stack_ffffffffffffff08;
  AnonADIOSFile **in_stack_ffffffffffffff10;
  _CMFormat **in_stack_ffffffffffffff18;
  _CMConnection **in_stack_ffffffffffffff20;
  _func_void__CMConnection_ptr__CMFormat_ptr_AnonADIOSFile_ptr_unsigned_long_complex<float>_ptr_void_ptr_int_Accuracy_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_DataType_unsigned_long_unsigned_long_vector<unsigned_long,_std::allocator<unsigned_long>_>_vector<unsigned_long,_std::allocator<unsigned_long>_>_unsigned_long_bool
  *in_stack_ffffffffffffff28;
  thread *this_00;
  int local_94;
  complex<float> **in_stack_ffffffffffffff70;
  void **in_stack_ffffffffffffff78;
  int *in_stack_ffffffffffffff80;
  Accuracy *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  DataType *in_stack_ffffffffffffff98;
  unsigned_long *in_stack_ffffffffffffffa0;
  unsigned_long *in_stack_ffffffffffffffa8;
  Variable *__args_12;
  undefined4 in_stack_ffffffffffffffc0;
  
  pVVar1 = adios2::core::IO::InquireVariable<std::complex<float>>
                     ((string *)
                      (in_R9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                      _M_impl.super__Vector_impl_data._M_start);
  __args_12 = pVVar1;
  if (*(int *)&in_R9[4].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage == 1) {
    std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long_&,_unsigned_long_&,_true>
              ((pair<unsigned_long,_unsigned_long> *)&stack0xffffffffffffffa0,
               (unsigned_long *)(*in_RDX + 0x18),(unsigned_long *)(*in_RDX + 0x20));
    adios2::core::VariableBase::SetStepSelection((pair *)pVVar1);
  }
  if (*(long *)(*in_RDX + 0x28) != -1) {
    adios2::core::VariableBase::SetBlockSelection((ulong)__args_12);
  }
  if (*(long *)(*in_RDX + 0x40) != 0) {
    std::
    pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::
    pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true>
              (in_stack_fffffffffffffe50);
    if (*(long *)(*in_RDX + 0x38) != 0) {
      for (local_94 = 0; local_94 < *(int *)(*in_RDX + 0x30); local_94 = local_94 + 1) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
      }
    }
    adios2::core::VariableBase::SetSelection((pair *)__args_12);
    std::
    pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::~pair(in_stack_fffffffffffffe50);
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"Reading var ");
  poVar2 = std::operator<<(poVar2,in_RCX);
  poVar2 = std::operator<<(poVar2," with ");
  if (*(char *)(*in_RDX + 0x58) == '\0') {
    local_110 = "absolute";
  }
  else {
    local_110 = "relative";
  }
  poVar2 = std::operator<<(poVar2,local_110);
  poVar2 = std::operator<<(poVar2," error ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(double *)(*in_RDX + 0x48));
  poVar2 = std::operator<<(poVar2," in norm ");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,*(double *)(*in_RDX + 0x50));
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  lVar4 = adios2::core::Variable<std::complex<float>>::SelectionSize();
  pvVar3 = malloc(lVar4 << 3);
  adios2::core::Engine::Get<std::complex<float>>
            ((Variable *)
             (in_R9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_finish,(complex *)__args_12,(Mode)pvVar3);
  WaitForAvailableThread();
  this_00 = *(thread **)(*in_RDX + 0x48);
  adios2::core::Variable<std::complex<float>>::Count();
  this = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&stack0xffffffffffffff30;
  std::thread::
  thread<void(&)(_CMConnection*,_CMFormat*,AnonADIOSFile*,unsigned_long,std::complex<float>*,void*,int,adios2::Accuracy,std::__cxx11::string,adios2::DataType,unsigned_long,unsigned_long,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<unsigned_long,std::allocator<unsigned_long>>,unsigned_long,bool),_CMConnection*&,_CMFormat*&,AnonADIOSFile*&,unsigned_long&,std::complex<float>*&,void*&,int&,adios2::Accuracy&,std::__cxx11::string_const&,adios2::DataType_const&,unsigned_long&,unsigned_long&,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<unsigned_long,std::allocator<unsigned_long>>&,unsigned_long&,bool,void>
            (this_00,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
             in_stack_ffffffffffffff10,
             (unsigned_long *)
             CONCAT17(*(int *)((complex *)__args_12 + 0x50) == 0,in_stack_ffffffffffffff08),
             in_stack_ffffffffffffff70,in_stack_ffffffffffffff78,in_stack_ffffffffffffff80,
             in_stack_ffffffffffffff88,in_stack_ffffffffffffff90,in_stack_ffffffffffffff98,
             in_stack_ffffffffffffffa0,in_stack_ffffffffffffffa8,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)__args_12,in_R9,
             (unsigned_long *)CONCAT44(in_R8D,in_stack_ffffffffffffffc0),(bool *)in_RCX);
  std::thread::detach();
  std::thread::~thread((thread *)0x124448);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(this);
  return;
}

Assistant:

void PrepareResponseForGet(CMConnection conn, struct Remote_evpath_state *ev_state,
                           GetRequestMsg &GetMsg, std::string &VarName, adios2::DataType TypeOfVar,
                           AnonADIOSFile *f)
{
    // This part cannot be threaded as ADIOS InquireVariable/Get are not thread-safe
    Variable<T> *var = f->m_io->InquireVariable<T>(VarName);
    if (f->m_mode == RemoteOpenRandomAccess)
        var->SetStepSelection({GetMsg->Step, GetMsg->StepCount});
    if (GetMsg->BlockID != -1)
        var->SetBlockSelection(GetMsg->BlockID);
    if (GetMsg->Start)
    {
        Box<Dims> b;
        if (GetMsg->Count)
        {
            for (int i = 0; i < GetMsg->DimCount; i++)
            {
                b.first.push_back(GetMsg->Start[i]);
                b.second.push_back(GetMsg->Count[i]);
            }
        }
        var->SetSelection(b);
    }
    std::cout << "Reading var " << VarName << " with "
              << (GetMsg->Relative ? "relative" : "absolute") << " error " << GetMsg->Error
              << " in norm " << GetMsg->Norm << std::endl;
    size_t readSize = var->SelectionSize() * sizeof(T);
    T *RawData = (T *)malloc(readSize);
    f->m_engine->Get(*var, RawData, Mode::Sync);

    WaitForAvailableThread(); /* blocking here until we can launch a thread */

    // Handle returning data in a separate thread so that we can serve another read operation in the
    // meantime. Compress data if possible and if requested.
    // Note: Can't pass Variable object to thread as other response will modify its content
    Accuracy acc = {GetMsg->Error, GetMsg->Norm, (bool)GetMsg->Relative};
    std::thread{ReturnResponseThread<T>,
                conn,
                ev_state->ReadResponseFormat,
                f,
                readSize,
                RawData,
                GetMsg->Dest,
                GetMsg->GetResponseCondition,
                acc,
                var->m_Name,
                var->m_Type,
                var->m_StepsStart,
                var->m_StepsCount,
                var->Count(), // function, not m_Count is correct for block selections
                var->m_Start,
                var->m_BlockID,
                (var->m_SelectionType == SelectionType::BoundingBox)}
        .detach();
    return;
}